

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::reverseDFS
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,int skip_n)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  int in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  reference rVar4;
  int o;
  int ie;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  reference in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  reference local_38;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa0._M_mask);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd0,true);
  local_38 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x198),(long)in_ESI);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar1) {
      return;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    iVar5 = *piVar3;
    GraphPropagator::getEdgeVar
              ((GraphPropagator *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    bVar1 = BoolView::isFixed((BoolView *)0x2b10bf);
    if (bVar1) {
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      bVar1 = BoolView::isFalse((BoolView *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      if (!bVar1) goto LAB_002b10e3;
    }
    else {
LAB_002b10e3:
      iVar2 = GraphPropagator::getTail
                        ((GraphPropagator *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
      in_stack_ffffffffffffff97 = true;
      if (iVar2 != in_ECX) {
        in_stack_ffffffffffffffa0 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)CONCAT44(iVar5,iVar2),
                        in_stack_ffffffffffffffa0._M_mask);
        in_stack_ffffffffffffff97 =
             std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0);
      }
      if ((bool)in_stack_ffffffffffffff97 == false) {
        reverseDFS((DReachabilityPropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (int)((ulong)in_RDX >> 0x20),
                   (vector<bool,_std::allocator<bool>_> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0)
                   ,rVar4._M_mask._4_4_);
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  } while( true );
}

Assistant:

void DReachabilityPropagator::reverseDFS(int u, std::vector<bool>& v, int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse()) {
			continue;
		}
		const int o = getTail(ie);
		if (o == skip_n || v[o]) {
			continue;
		}
		reverseDFS(o, v, skip_n);
	}
}